

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O3

int Assimp_Info(char **params,uint num)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  aiTextureType type;
  aiNode *paVar6;
  aiMesh **ppaVar7;
  aiMesh *paVar8;
  bool bVar9;
  byte bVar10;
  bool verbose;
  uint cnt_2;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  aiReturn aVar15;
  aiScene *scene;
  bool bVar16;
  uint i;
  ulong uVar17;
  long lVar18;
  uint i_2;
  ulong uVar19;
  uint cnt_1;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  uint cnt;
  int iVar27;
  aiVector3D special_points [3];
  ImportData import;
  string in;
  aiMemoryInfo mem;
  aiString name;
  undefined1 local_4d8 [12];
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  ImportData local_4a8;
  string local_478;
  aiMemoryInfo local_458;
  undefined1 local_438 [1032];
  
  pcVar23 = *params;
  if (*pcVar23 == '-') {
    if ((((pcVar23[1] == 'h') && (pcVar23[2] == '\0')) ||
        (iVar11 = strcmp(pcVar23,"--help"), iVar11 == 0)) ||
       ((pcVar23[1] == '?' && (pcVar23[2] == '\0')))) {
LAB_002e6db6:
      printf("%s",AICMD_MSG_INFO_HELP_E);
      return 0;
    }
  }
  else {
    iVar11 = strcmp(pcVar23,"--help");
    if (iVar11 == 0) goto LAB_002e6db6;
  }
  if (num == 0) {
    puts("assimp info: Invalid number of arguments. See \'assimp info --help\'");
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,pcVar23,(allocator<char> *)local_438);
  if (num == 1) {
    bVar9 = false;
    verbose = false;
    bVar16 = false;
  }
  else {
    uVar25 = 1;
    bVar10 = 0;
    verbose = false;
    bVar16 = false;
    do {
      pcVar23 = params[uVar25];
      iVar11 = strcmp(pcVar23,"--raw");
      if ((iVar11 == 0) || (((*pcVar23 == '-' && (pcVar23[1] == 'r')) && (pcVar23[2] == '\0')))) {
        bVar16 = true;
      }
      iVar11 = strcmp(pcVar23,"--verbose");
      if ((iVar11 == 0) || (((*pcVar23 == '-' && (pcVar23[1] == 'v')) && (pcVar23[2] == '\0')))) {
        verbose = true;
      }
      iVar11 = strcmp(pcVar23,"--silent");
      if ((iVar11 == 0) || (((*pcVar23 == '-' && (pcVar23[1] == 's')) && (pcVar23[2] == '\0')))) {
        bVar10 = 1;
      }
      uVar25 = uVar25 + 1;
    } while (num != uVar25);
    if ((bool)(verbose & bVar10)) {
      printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. ");
      iVar11 = 1;
      goto LAB_002e762f;
    }
    bVar9 = (bool)((verbose ^ 1U) & bVar10);
  }
  local_4a8.logFile._M_dataplus._M_p = (pointer)&local_4a8.logFile.field_2;
  local_4a8.ppFlags = 0;
  local_4a8.showLog = false;
  local_4a8.logFile._M_string_length = 0;
  local_4a8.logFile.field_2._M_local_buf[0] = '\0';
  local_4a8.verbose = false;
  local_4a8.log = false;
  if ((!bVar16) && (ProcessStandardArguments(&local_4a8,params + 1,num - 1), local_4a8.ppFlags == 0)
     ) {
    local_4a8.ppFlags = 0x379ecb;
  }
  scene = ImportModel(&local_4a8,&local_478);
  if (scene == (aiScene *)0x0) {
    printf("assimp info: Unable to load input file %s\n",local_478._M_dataplus._M_p);
    iVar11 = 5;
  }
  else {
    local_458.animations = 0;
    local_458.cameras = 0;
    local_458.lights = 0;
    local_458.total = 0;
    local_458.textures = 0;
    local_458.materials = 0;
    local_458.meshes = 0;
    local_458.nodes = 0;
    Assimp::Importer::GetMemoryRequirements(globalImporter,&local_458);
    local_4c8 = 0;
    uStack_4c0 = 0;
    local_4d8._0_4_ = 0.0;
    local_4d8._4_4_ = 0.0;
    stack0xfffffffffffffb30 = 0;
    local_4b8 = 0.0;
    FindSpecialPoints(scene,(aiVector3D *)local_4d8);
    uVar25 = (ulong)local_458._24_8_ >> 0x20;
    paVar6 = scene->mRootNode;
    uVar12 = CountNodes(paVar6);
    uVar13 = GetMaxDepth(paVar6);
    uVar24 = (ulong)scene->mNumMeshes;
    iVar11 = 0;
    uVar22 = (ulong)scene->mNumAnimations;
    iVar27 = 0;
    iVar26 = 0;
    iVar20 = 0;
    if (uVar24 != 0) {
      ppaVar7 = scene->mMeshes;
      uVar17 = 0;
      iVar26 = 0;
      do {
        iVar26 = iVar26 + ppaVar7[uVar17]->mNumVertices;
        uVar17 = uVar17 + 1;
      } while (uVar24 != uVar17);
      uVar17 = 0;
      iVar27 = 0;
      do {
        iVar27 = iVar27 + ppaVar7[uVar17]->mNumFaces;
        uVar17 = uVar17 + 1;
      } while (uVar24 != uVar17);
      uVar17 = 0;
      iVar20 = 0;
      do {
        iVar20 = iVar20 + ppaVar7[uVar17]->mNumBones;
        uVar17 = uVar17 + 1;
      } while (uVar24 != uVar17);
    }
    if (uVar22 != 0) {
      uVar17 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + scene->mAnimations[uVar17]->mNumChannels;
        uVar17 = uVar17 + 1;
      } while (uVar22 != uVar17);
    }
    uVar1 = scene->mNumMaterials;
    uVar2 = scene->mNumTextures;
    uVar3 = scene->mNumCameras;
    uVar4 = scene->mNumLights;
    FindPTypes_abi_cxx11_((string *)local_438,scene);
    uVar5 = scene->mNumMeshes;
    uVar17 = (ulong)uVar5;
    if (uVar17 == 0) {
      uVar14 = 0;
      uVar21 = 0;
    }
    else {
      uVar19 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 + scene->mMeshes[uVar19]->mNumFaces;
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
      uVar19 = 0;
      uVar21 = 0;
      do {
        uVar21 = uVar21 + scene->mMeshes[uVar19]->mNumVertices;
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
      uVar14 = uVar14 / uVar5;
      uVar21 = uVar21 / uVar5;
    }
    printf("Memory consumption: %i B\nNodes:              %i\nMaximum depth       %i\nMeshes:             %i\nAnimations:         %i\nTextures (embed.):  %i\nMaterials:          %i\nCameras:            %i\nLights:             %i\nVertices:           %i\nFaces:              %i\nBones:              %i\nAnimation Channels: %i\nPrimitive Types:    %s\nAverage faces/mesh  %i\nAverage verts/mesh  %i\nMinimum point      (%f %f %f)\nMaximum point      (%f %f %f)\nCenter point       (%f %f %f)\n"
           ,SUB84((double)(float)local_4d8._0_4_,0),(double)(float)local_4d8._4_4_,
           (double)(float)local_4d8._8_4_,(double)fStack_4cc,(double)(float)local_4c8,
           (double)local_4c8._4_4_,(double)(float)uStack_4c0,(double)uStack_4c0._4_4_,uVar25,
           (ulong)uVar12,(ulong)uVar13,uVar24,uVar22,uVar2,uVar1,uVar3,uVar4,iVar26,iVar27,iVar20,
           iVar11,local_438._0_8_,uVar14,uVar21,(double)local_4b8);
    if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
      operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
    }
    if (!bVar9) {
      if ((scene->mNumMeshes != 0) &&
         (puts("\nMeshes:  (name) [vertices / bones / faces | primitive_types]"),
         scene->mNumMeshes != 0)) {
        uVar25 = 0;
        do {
          paVar8 = scene->mMeshes[uVar25];
          printf("    %d (%s)",uVar25 & 0xffffffff,(paVar8->mName).data);
          printf(": [%d / %d / %d |",(ulong)paVar8->mNumVertices,(ulong)paVar8->mNumBones);
          uVar12 = paVar8->mPrimitiveTypes;
          if ((uVar12 & 1) != 0) {
            printf(" point");
          }
          if ((uVar12 & 2) != 0) {
            printf(" line");
          }
          if ((uVar12 & 4) != 0) {
            printf(" triangle");
          }
          if ((uVar12 & 8) != 0) {
            printf(" polygon");
          }
          puts("]");
          uVar25 = uVar25 + 1;
        } while (uVar25 < scene->mNumMeshes);
      }
      if (scene->mNumMaterials != 0) {
        uVar25 = 0;
        iVar11 = 0;
        do {
          local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
          memset(local_438 + 5,0x1b,0x3ff);
          aVar15 = aiGetMaterialString(scene->mMaterials[uVar25],"?mat.name",0,0,
                                       (aiString *)local_438);
          if (aVar15 == aiReturn_SUCCESS) {
            pcVar23 = "";
            if (iVar11 == 0) {
              pcVar23 = "\nNamed Materials:";
            }
            printf("%s\n    \'%s\'",pcVar23,local_438 + 4);
            iVar11 = iVar11 + 1;
          }
          uVar25 = uVar25 + 1;
          uVar12 = scene->mNumMaterials;
        } while (uVar25 < uVar12);
        if (iVar11 != 0) {
          putchar(10);
          uVar12 = scene->mNumMaterials;
        }
        if (uVar12 != 0) {
          uVar25 = 0;
          iVar11 = 0;
          do {
            local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
            memset(local_438 + 5,0x1b,0x3ff);
            lVar18 = 0;
            do {
              iVar20 = iVar11;
              type = Assimp_Info::types[lVar18];
              uVar12 = 0;
              while( true ) {
                aVar15 = aiGetMaterialString(scene->mMaterials[uVar25],"$tex.file",type,uVar12,
                                             (aiString *)local_438);
                if (aVar15 != aiReturn_SUCCESS) break;
                pcVar23 = "";
                if (uVar12 + iVar20 == 0) {
                  pcVar23 = "\nTexture Refs:";
                }
                printf("%s\n    \'%s\'",pcVar23,local_438 + 4);
                uVar12 = uVar12 + 1;
              }
              lVar18 = lVar18 + 1;
              iVar11 = uVar12 + iVar20;
            } while (lVar18 != 0xd);
            uVar25 = uVar25 + 1;
            iVar11 = uVar12 + iVar20;
          } while (uVar25 < scene->mNumMaterials);
          if (iVar20 + uVar12 != 0) {
            putchar(10);
          }
        }
      }
      uVar12 = scene->mNumAnimations;
      if (uVar12 != 0) {
        uVar25 = 0;
        iVar11 = 0;
        do {
          if ((scene->mAnimations[uVar25]->mName).length != 0) {
            pcVar23 = "";
            if (iVar11 == 0) {
              pcVar23 = "\nNamed Animations:";
            }
            printf("%s\n     \'%s\'",pcVar23,(scene->mAnimations[uVar25]->mName).data);
            uVar12 = scene->mNumAnimations;
            iVar11 = iVar11 + 1;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 < uVar12);
        if (iVar11 != 0) {
          putchar(10);
        }
      }
      puts("\nNode hierarchy:");
      paVar6 = scene->mRootNode;
      local_438._0_8_ = local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
      PrintHierarchy(paVar6,(string *)local_438,verbose,false,true);
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
    }
    putchar(10);
    iVar11 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8.logFile._M_dataplus._M_p != &local_4a8.logFile.field_2) {
    operator_delete(local_4a8.logFile._M_dataplus._M_p,
                    CONCAT71(local_4a8.logFile.field_2._M_allocated_capacity._1_7_,
                             local_4a8.logFile.field_2._M_local_buf[0]) + 1);
  }
LAB_002e762f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p == &local_478.field_2) {
    return iVar11;
  }
  operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  return iVar11;
}

Assistant:

int Assimp_Info (const char* const* params, unsigned int num) {
	// --help
	if (!strcmp( params[0],"-h")||!strcmp( params[0],"--help")||!strcmp( params[0],"-?") ) {
		printf("%s",AICMD_MSG_INFO_HELP_E);
		return 0;
	}

	// asssimp info <file> [-r]
	if (num < 1) {
		printf("assimp info: Invalid number of arguments. "
			"See \'assimp info --help\'\n");
		return 1;
	}

	const std::string in  = std::string(params[0]);

	// get -r and -v arguments
	bool raw = false;
	bool verbose = false;
	bool silent = false;
	for(unsigned int i = 1; i < num; ++i) {
		if (!strcmp(params[i],"--raw")||!strcmp(params[i],"-r")) {
			raw = true;
		}
		if (!strcmp(params[i],"--verbose")||!strcmp(params[i],"-v")) {
			verbose = true;
		}
		if (!strcmp(params[i], "--silent") || !strcmp(params[i], "-s")) {
			silent = true;
		}
	}

	// Verbose and silent at the same time are not allowed
	if ( verbose && silent ) {
		printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. ");
		return 1;
	}
	
	// Parse post-processing flags unless -r was specified
	ImportData import;
	if (!raw) {
		// get import flags
		ProcessStandardArguments(import, params + 1, num - 1);

		//No custom post process flags defined, we set all the post process flags active
		if(import.ppFlags == 0)
			import.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
	}

	// import the main model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		printf("assimp info: Unable to load input file %s\n",
			in.c_str());
		return 5;
	}

	aiMemoryInfo mem;
	globalImporter->GetMemoryRequirements(mem);


	static const char* format_string =
		"Memory consumption: %i B\n"
		"Nodes:              %i\n"
		"Maximum depth       %i\n"
		"Meshes:             %i\n"
		"Animations:         %i\n"
		"Textures (embed.):  %i\n"
		"Materials:          %i\n"
		"Cameras:            %i\n"
		"Lights:             %i\n"
		"Vertices:           %i\n"
		"Faces:              %i\n"
		"Bones:              %i\n"
		"Animation Channels: %i\n"
		"Primitive Types:    %s\n"
		"Average faces/mesh  %i\n"
		"Average verts/mesh  %i\n"
		"Minimum point      (%f %f %f)\n"
		"Maximum point      (%f %f %f)\n"
		"Center point       (%f %f %f)\n"

		;

	aiVector3D special_points[3];
	FindSpecialPoints(scene,special_points);
	printf(format_string,
		mem.total,
		CountNodes(scene->mRootNode),
		GetMaxDepth(scene->mRootNode),
		scene->mNumMeshes,
		scene->mNumAnimations,
		scene->mNumTextures,
		scene->mNumMaterials,
		scene->mNumCameras,
		scene->mNumLights,
		CountVertices(scene),
		CountFaces(scene),
		CountBones(scene),
		CountAnimChannels(scene),
		FindPTypes(scene).c_str(),
		GetAvgFacePerMesh(scene),
		GetAvgVertsPerMesh(scene),
		special_points[0][0],special_points[0][1],special_points[0][2],
		special_points[1][0],special_points[1][1],special_points[1][2],
		special_points[2][0],special_points[2][1],special_points[2][2]
		)
	;

	if (silent)
	{
		printf("\n");
		return 0;
	}

	// meshes
	if (scene->mNumMeshes) {
		printf("\nMeshes:  (name) [vertices / bones / faces | primitive_types]\n");
	}
	for (unsigned int i = 0; i < scene->mNumMeshes; ++i) {
		const aiMesh* mesh = scene->mMeshes[i];
		printf("    %d (%s)", i, mesh->mName.C_Str());
		printf(
			": [%d / %d / %d |",
			mesh->mNumVertices,
			mesh->mNumBones,
			mesh->mNumFaces
		);
		const unsigned int ptypes = mesh->mPrimitiveTypes;
		if (ptypes & aiPrimitiveType_POINT) { printf(" point"); }
		if (ptypes & aiPrimitiveType_LINE) { printf(" line"); }
		if (ptypes & aiPrimitiveType_TRIANGLE) { printf(" triangle"); }
		if (ptypes & aiPrimitiveType_POLYGON) { printf(" polygon"); }
		printf("]\n");
	}

	// materials
	unsigned int total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		if (AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],AI_MATKEY_NAME,&name)) {
			printf("%s\n    \'%s\'",(total++?"":"\nNamed Materials:" ),name.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// textures
	total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		static const aiTextureType types[] = {
			aiTextureType_NONE,
			aiTextureType_DIFFUSE,
			aiTextureType_SPECULAR,
			aiTextureType_AMBIENT,
			aiTextureType_EMISSIVE,
			aiTextureType_HEIGHT,
			aiTextureType_NORMALS,
			aiTextureType_SHININESS,
			aiTextureType_OPACITY,
			aiTextureType_DISPLACEMENT,
			aiTextureType_LIGHTMAP,
			aiTextureType_REFLECTION,
			aiTextureType_UNKNOWN
		};
		for(unsigned int type = 0; type < sizeof(types)/sizeof(types[0]); ++type) {
			for(unsigned int idx = 0;AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],
				AI_MATKEY_TEXTURE(types[type],idx),&name); ++idx) {
				printf("%s\n    \'%s\'",(total++?"":"\nTexture Refs:" ),name.data);
			}
		}
	}
	if(total) {
		printf("\n");
	}

	// animations
	total=0;
	for(unsigned int i = 0;i < scene->mNumAnimations; ++i) {
		if (scene->mAnimations[i]->mName.length) {
			printf("%s\n     \'%s\'",(total++?"":"\nNamed Animations:" ),scene->mAnimations[i]->mName.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// node hierarchy
	printf("\nNode hierarchy:\n");
	PrintHierarchy(scene->mRootNode,"",verbose);

	printf("\n");
	return 0;
}